

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils-inl.hpp
# Opt level: O0

void CoreMLConverter::unsupportedCaffeParrameter
               (string *parameterName,string *layerName,string *layerType)

{
  ostream *poVar1;
  runtime_error *this;
  string local_1d8 [48];
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  string *local_20;
  string *layerType_local;
  string *layerName_local;
  string *parameterName_local;
  
  local_20 = layerType;
  layerType_local = layerName;
  layerName_local = parameterName;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,"Unsupported parameter \'");
  poVar1 = std::operator<<(poVar1,(string *)layerName_local);
  poVar1 = std::operator<<(poVar1,"\' in caffe layer \'");
  poVar1 = std::operator<<(poVar1,(string *)layerType_local);
  poVar1 = std::operator<<(poVar1,"\' of type \'");
  poVar1 = std::operator<<(poVar1,(string *)local_20);
  poVar1 = std::operator<<(poVar1,"\'.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  std::runtime_error::runtime_error(this,local_1d8);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void unsupportedCaffeParrameter(const std::string& parameterName,
                                    const std::string& layerName,
                                    const std::string& layerType) {
        
        std::stringstream ss;
        ss << "Unsupported parameter '" << parameterName << "' in caffe layer '"
           << layerName  << "' of type '"<< layerType << "'." << std::endl;
        throw std::runtime_error(ss.str());
    }